

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void duckdb_je_dallocx(void *ptr,int flags)

{
  ulong uVar1;
  uint64_t uVar2;
  size_t __n;
  tcaches_t *ptVar3;
  tsd_t *tsd;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  void **ppvVar4;
  uintptr_t in_RCX;
  cache_bin_t *pcVar5;
  uint uVar6;
  uintptr_t in_R8;
  cache_bin_t *bin;
  bool bVar7;
  rtree_metadata_t rVar8;
  te_ctx_t local_78;
  rtree_ctx_t *rtree_ctx_1;
  uintptr_t args_raw [3];
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_027efab8);
  bVar7 = true;
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,true);
    bVar7 = (tsd->state).repr == '\0';
  }
  ptVar3 = duckdb_je_tcaches;
  uVar6 = flags & 0xfff00;
  if (uVar6 == 0) {
LAB_01f7a52f:
    if (!bVar7) {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0') {
        tcache.tcache = (tcache_t *)0x0;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
          tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        }
      }
      else {
        tcache.tcache = (tcache_t *)0x0;
      }
LAB_01f7a69a:
      args_raw[1] = (uintptr_t)flags;
      args_raw[2] = 0;
      args_raw[0] = (uintptr_t)ptr;
      duckdb_je_hook_invoke_dalloc(hook_dalloc_dallocx,ptr,args_raw);
      rtree_ctx_1 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      rVar8 = rtree_metadata_read((tsdn_t *)tsd,(rtree_t *)rtree_ctx_1,(rtree_ctx_t *)ptr,in_RCX);
      uVar6 = rVar8.szind;
      __n = duckdb_je_sz_index2size_tab[uVar6];
      if (duckdb_je_opt_junk_free == true) {
        switchD_016d4fed::default(ptr,0x5a,__n);
      }
      if (tcache.tcache == (tcache_t *)0x0) {
        arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
      }
      else if ((rVar8._8_4_ >> 8 & 1) == 0) {
        if ((uVar6 < (tcache.tcache)->tcache_slow->tcache_nbins) &&
           (ppvVar4 = (tcache.tcache)->bins[uVar6].stack_head,
           ppvVar4 != (void **)&duckdb_je_disabled_bin)) {
          pcVar5 = (tcache.tcache)->bins + uVar6;
          if ((tcache.tcache)->bins[uVar6].low_bits_full == (uint16_t)ppvVar4) {
            duckdb_je_tcache_bin_flush_large
                      (tsd,tcache.tcache,pcVar5,uVar6,
                       (uint)((tcache.tcache)->bins[uVar6].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            ppvVar4 = pcVar5->stack_head;
            if ((tcache.tcache)->bins[uVar6].low_bits_full != (uint16_t)ppvVar4) goto LAB_01f7a731;
          }
          else {
            pcVar5->stack_head = ppvVar4 + -1;
            ppvVar4[-1] = ptr;
          }
        }
        else {
          rtree_read((rtree_contents_t *)&local_78,(tsdn_t *)tsd,(rtree_t *)rtree_ctx_1,
                     (rtree_ctx_t *)ptr,in_R8);
          duckdb_je_large_dalloc
                    ((tsdn_t *)tsd,(edata_t *)CONCAT71(local_78._1_7_,local_78.is_alloc));
        }
      }
      else {
        pcVar5 = (tcache.tcache)->bins + uVar6;
        ppvVar4 = pcVar5->stack_head;
        if ((tcache.tcache)->bins[uVar6].low_bits_full == (uint16_t)ppvVar4) {
          if (ppvVar4 == (void **)&duckdb_je_disabled_bin) {
            duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
          }
          else {
            duckdb_je_tcache_bin_flush_small
                      (tsd,tcache.tcache,pcVar5,uVar6,
                       (uint)((tcache.tcache)->bins[uVar6].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
            ppvVar4 = pcVar5->stack_head;
            if ((tcache.tcache)->bins[uVar6].low_bits_full != (uint16_t)ppvVar4) goto LAB_01f7a731;
          }
        }
        else {
LAB_01f7a731:
          pcVar5->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
        }
      }
      uVar2 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar2 + __n;
      if (__n < tsd->
                cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event
                - uVar2) {
        return;
      }
      goto LAB_01f7a78e;
    }
    tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
  }
  else {
    if ((uVar6 == 0x100) || (uVar6 >> 8 == 1)) {
      tcache.tcache = (tcache_t *)0x0;
    }
    else {
      if (uVar6 == 0) goto LAB_01f7a52f;
      uVar6 = (uVar6 >> 8) - 2;
      tcache = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcaches[uVar6].field_0.tcache;
      if (tcache == (tcache_t *)0x0) {
        duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
        abort();
      }
      if (tcache == (tcache_t *)0x1) {
        tcache.tcache = duckdb_je_tcache_create_explicit(tsd);
        ptVar3[uVar6].field_0.tcache = (tcache_t *)tcache;
      }
    }
    if (!bVar7) goto LAB_01f7a69a;
  }
  rVar8 = rtree_metadata_read((tsdn_t *)tsd,
                              (rtree_t *)
                              &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                              (rtree_ctx_t *)ptr,in_RCX);
  uVar6 = rVar8.szind;
  uVar1 = duckdb_je_sz_index2size_tab[uVar6];
  if (tcache.tcache == (tcache_t *)0x0) {
    arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
  }
  else if ((rVar8._8_4_ >> 8 & 1) == 0) {
    if ((uVar6 < (tcache.tcache)->tcache_slow->tcache_nbins) &&
       (ppvVar4 = (tcache.tcache)->bins[uVar6].stack_head,
       ppvVar4 != (void **)&duckdb_je_disabled_bin)) {
      pcVar5 = (tcache.tcache)->bins + uVar6;
      if ((tcache.tcache)->bins[uVar6].low_bits_full == (uint16_t)ppvVar4) {
        duckdb_je_tcache_bin_flush_large
                  (tsd,tcache.tcache,pcVar5,uVar6,
                   (uint)((tcache.tcache)->bins[uVar6].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_01f7a839;
      }
      goto LAB_01f7a590;
    }
    rtree_read((rtree_contents_t *)&local_78,(tsdn_t *)tsd,
               (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
               (rtree_ctx_t *)ptr,in_R8);
    duckdb_je_large_dalloc((tsdn_t *)tsd,(edata_t *)CONCAT71(local_78._1_7_,local_78.is_alloc));
  }
  else {
    pcVar5 = (tcache.tcache)->bins + uVar6;
    ppvVar4 = pcVar5->stack_head;
    if ((tcache.tcache)->bins[uVar6].low_bits_full == (uint16_t)ppvVar4) {
      if (ppvVar4 == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
      }
      else {
        duckdb_je_tcache_bin_flush_small
                  (tsd,tcache.tcache,pcVar5,uVar6,
                   (uint)((tcache.tcache)->bins[uVar6].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01f7a839:
        ppvVar4 = pcVar5->stack_head;
        if (pcVar5->low_bits_full != (uint16_t)ppvVar4) {
          pcVar5->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
        }
      }
    }
    else {
LAB_01f7a590:
      pcVar5->stack_head = ppvVar4 + -1;
      ppvVar4[-1] = ptr;
    }
  }
  uVar2 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar2 + uVar1;
  if (uVar1 < tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
              uVar2) {
    return;
  }
LAB_01f7a78e:
  local_78.next_event_fast =
       &tsd->
        cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
  local_78.next_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_78.last_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_78.current = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_78.is_alloc = false;
  duckdb_je_te_event_trigger(tsd,&local_78);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_dallocx(void *ptr, int flags) {
	LOG("core.dallocx.entry", "ptr: %p, flags: %d", ptr, flags);

	assert(ptr != NULL);
	assert(malloc_initialized() || IS_INITIALIZER);

	tsd_t *tsd = tsd_fetch_min();
	bool fast = tsd_fast(tsd);
	check_entry_exit_locking(tsd_tsdn(tsd));

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind, !fast,
	    /* is_alloc */ false);

	UTRACE(ptr, 0, 0);
	if (likely(fast)) {
		tsd_assert_fast(tsd);
		ifree(tsd, ptr, tcache, false);
	} else {
		uintptr_t args_raw[3] = {(uintptr_t)ptr, flags};
		hook_invoke_dalloc(hook_dalloc_dallocx, ptr, args_raw);
		ifree(tsd, ptr, tcache, true);
	}
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.dallocx.exit", "");
}